

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_view_args.cpp
# Opt level: O2

void node::ReadCoinsViewArgs(ArgsManager *args,CoinsViewOptions *options)

{
  long in_FS_OFFSET;
  optional<long> oVar1;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-dbbatchsize",&local_49);
  oVar1 = ArgsManager::GetIntArg(args,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((undefined1  [16])
       oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    options->batch_write_bytes =
         oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-dbcrashratio",&local_49);
  oVar1 = ArgsManager::GetIntArg(args,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((undefined1  [16])
       oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    options->simulate_crash_ratio =
         oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload._0_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReadCoinsViewArgs(const ArgsManager& args, CoinsViewOptions& options)
{
    if (auto value = args.GetIntArg("-dbbatchsize")) options.batch_write_bytes = *value;
    if (auto value = args.GetIntArg("-dbcrashratio")) options.simulate_crash_ratio = *value;
}